

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

color * __thiscall
camera::ray_color(color *__return_storage_ptr__,camera *this,ray *r,int depth,hittable *world,
                 hittable *lights)

{
  int iVar1;
  uint uVar2;
  element_type *peVar3;
  vec3 *direction;
  mixture_pdf *this_00;
  double time;
  double t;
  double t_00;
  vec3 local_260;
  vec3 local_248;
  undefined1 local_230 [8];
  color color_from_scatter;
  color sample_color;
  double scattering_pdf;
  double pdf_value;
  undefined1 local_1d8 [8];
  ray scattered;
  shared_ptr<pdf> local_190;
  undefined1 local_180 [8];
  mixture_pdf p;
  shared_ptr<hittable_pdf> light_ptr;
  undefined1 local_130 [8];
  color color_from_emission;
  scatter_record srec;
  interval local_a0;
  undefined1 local_90 [8];
  hit_record rec;
  hittable *lights_local;
  hittable *world_local;
  int depth_local;
  ray *r_local;
  camera *this_local;
  
  rec._88_8_ = lights;
  if (depth < 1) {
    vec3::vec3(__return_storage_ptr__,0.0,0.0,0.0);
  }
  else {
    hit_record::hit_record((hit_record *)local_90);
    interval::interval(&local_a0,0.001,INFINITY);
    iVar1 = (*world->_vptr_hittable[2])(local_a0.min,local_a0.max,world,r,local_90);
    if ((((byte)iVar1 ^ 0xff) & 1) == 0) {
      scatter_record::scatter_record((scatter_record *)(color_from_emission.e + 2));
      peVar3 = std::__shared_ptr_access<material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<material,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )(rec.normal.e + 2));
      (*peVar3->_vptr_material[2])(rec.t,rec.u,local_130,peVar3,r,local_90);
      peVar3 = std::__shared_ptr_access<material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<material,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )(rec.normal.e + 2));
      uVar2 = (*peVar3->_vptr_material[3])(peVar3,r,local_90,color_from_emission.e + 2);
      if ((uVar2 & 1) == 0) {
        __return_storage_ptr__->e[0] = (double)local_130;
        __return_storage_ptr__->e[1] = color_from_emission.e[0];
        __return_storage_ptr__->e[2] = color_from_emission.e[1];
        srec.skip_pdf_ray.tm._0_4_ = 1;
      }
      else if (((byte)srec.pdf_ptr.super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi & 1) == 0) {
        std::make_shared<hittable_pdf,hittable_const&,vec3&>
                  ((hittable *)
                   &p.p[1].super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (vec3 *)rec._88_8_);
        std::shared_ptr<pdf>::shared_ptr<hittable_pdf,void>
                  (&local_190,
                   (shared_ptr<hittable_pdf> *)
                   &p.p[1].super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::shared_ptr<pdf>::shared_ptr
                  ((shared_ptr<pdf> *)&scattered.tm,(shared_ptr<pdf> *)(srec.attenuation.e + 2));
        mixture_pdf::mixture_pdf
                  ((mixture_pdf *)local_180,&local_190,(shared_ptr<pdf> *)&scattered.tm);
        std::shared_ptr<pdf>::~shared_ptr((shared_ptr<pdf> *)&scattered.tm);
        std::shared_ptr<pdf>::~shared_ptr(&local_190);
        this_00 = (mixture_pdf *)local_180;
        mixture_pdf::generate((vec3 *)&pdf_value,this_00);
        ray::time(r,(time_t *)this_00);
        ray::ray((ray *)local_1d8,(point3 *)local_90,(vec3 *)&pdf_value,time);
        direction = ray::direction((ray *)local_1d8);
        t = mixture_pdf::value((mixture_pdf *)local_180,direction);
        peVar3 = std::__shared_ptr_access<material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(rec.normal.e + 2));
        (*peVar3->_vptr_material[4])(peVar3,r,local_90,local_1d8);
        ray_color((color *)(color_from_scatter.e + 2),this,(ray *)local_1d8,depth + -1,world,
                  (hittable *)rec._88_8_);
        operator*(&local_260,(vec3 *)(color_from_emission.e + 2),t_00);
        operator*(&local_248,&local_260,(vec3 *)(color_from_scatter.e + 2));
        operator/((vec3 *)local_230,&local_248,t);
        operator+(__return_storage_ptr__,(vec3 *)local_130,(vec3 *)local_230);
        srec.skip_pdf_ray.tm._0_4_ = 1;
        mixture_pdf::~mixture_pdf((mixture_pdf *)local_180);
        std::shared_ptr<hittable_pdf>::~shared_ptr
                  ((shared_ptr<hittable_pdf> *)
                   &p.p[1].super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      else {
        ray_color((color *)&light_ptr.super___shared_ptr<hittable_pdf,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,this,(ray *)&srec.skip_pdf,depth + -1,world,
                  (hittable *)rec._88_8_);
        operator*(__return_storage_ptr__,(vec3 *)(color_from_emission.e + 2),
                  (vec3 *)&light_ptr.super___shared_ptr<hittable_pdf,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
        srec.skip_pdf_ray.tm._0_4_ = 1;
      }
      scatter_record::~scatter_record((scatter_record *)(color_from_emission.e + 2));
    }
    else {
      __return_storage_ptr__->e[0] = (this->background).e[0];
      __return_storage_ptr__->e[1] = (this->background).e[1];
      __return_storage_ptr__->e[2] = (this->background).e[2];
      srec.skip_pdf_ray.tm._0_4_ = 1;
    }
    hit_record::~hit_record((hit_record *)local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

color ray_color(const ray& r, int depth, const hittable& world, const hittable& lights)
    const {
        // If we've exceeded the ray bounce limit, no more light is gathered.
        if (depth <= 0)
            return color(0,0,0);

        hit_record rec;

        // If the ray hits nothing, return the background color.
        if (!world.hit(r, interval(0.001, infinity), rec))
            return background;

        scatter_record srec;
        color color_from_emission = rec.mat->emitted(r, rec, rec.u, rec.v, rec.p);

        if (!rec.mat->scatter(r, rec, srec))
            return color_from_emission;

        if (srec.skip_pdf) {
            return srec.attenuation * ray_color(srec.skip_pdf_ray, depth-1, world, lights);
        }

        auto light_ptr = make_shared<hittable_pdf>(lights, rec.p);
        mixture_pdf p(light_ptr, srec.pdf_ptr);

        ray scattered = ray(rec.p, p.generate(), r.time());
        auto pdf_value = p.value(scattered.direction());

        double scattering_pdf = rec.mat->scattering_pdf(r, rec, scattered);

        color sample_color = ray_color(scattered, depth-1, world, lights);
        color color_from_scatter =
            (srec.attenuation * scattering_pdf * sample_color) / pdf_value;

        return color_from_emission + color_from_scatter;
    }